

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_IBM_vertex_array_lists(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_IBM_vertex_array_lists != 0) {
    glad_glColorPointerListIBM = (PFNGLCOLORPOINTERLISTIBMPROC)(*load)("glColorPointerListIBM");
    glad_glSecondaryColorPointerListIBM =
         (PFNGLSECONDARYCOLORPOINTERLISTIBMPROC)(*load)("glSecondaryColorPointerListIBM");
    glad_glEdgeFlagPointerListIBM =
         (PFNGLEDGEFLAGPOINTERLISTIBMPROC)(*load)("glEdgeFlagPointerListIBM");
    glad_glFogCoordPointerListIBM =
         (PFNGLFOGCOORDPOINTERLISTIBMPROC)(*load)("glFogCoordPointerListIBM");
    glad_glIndexPointerListIBM = (PFNGLINDEXPOINTERLISTIBMPROC)(*load)("glIndexPointerListIBM");
    glad_glNormalPointerListIBM = (PFNGLNORMALPOINTERLISTIBMPROC)(*load)("glNormalPointerListIBM");
    glad_glTexCoordPointerListIBM =
         (PFNGLTEXCOORDPOINTERLISTIBMPROC)(*load)("glTexCoordPointerListIBM");
    glad_glVertexPointerListIBM = (PFNGLVERTEXPOINTERLISTIBMPROC)(*load)("glVertexPointerListIBM");
  }
  return;
}

Assistant:

static void load_GL_IBM_vertex_array_lists(GLADloadproc load) {
	if(!GLAD_GL_IBM_vertex_array_lists) return;
	glad_glColorPointerListIBM = (PFNGLCOLORPOINTERLISTIBMPROC)load("glColorPointerListIBM");
	glad_glSecondaryColorPointerListIBM = (PFNGLSECONDARYCOLORPOINTERLISTIBMPROC)load("glSecondaryColorPointerListIBM");
	glad_glEdgeFlagPointerListIBM = (PFNGLEDGEFLAGPOINTERLISTIBMPROC)load("glEdgeFlagPointerListIBM");
	glad_glFogCoordPointerListIBM = (PFNGLFOGCOORDPOINTERLISTIBMPROC)load("glFogCoordPointerListIBM");
	glad_glIndexPointerListIBM = (PFNGLINDEXPOINTERLISTIBMPROC)load("glIndexPointerListIBM");
	glad_glNormalPointerListIBM = (PFNGLNORMALPOINTERLISTIBMPROC)load("glNormalPointerListIBM");
	glad_glTexCoordPointerListIBM = (PFNGLTEXCOORDPOINTERLISTIBMPROC)load("glTexCoordPointerListIBM");
	glad_glVertexPointerListIBM = (PFNGLVERTEXPOINTERLISTIBMPROC)load("glVertexPointerListIBM");
}